

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O0

ER __thiscall
slang::ast::PatternCaseStatement::evalImpl(PatternCaseStatement *this,EvalContext *context)

{
  SourceRange range;
  string_view arg;
  SourceRange range_00;
  SourceRange range_01;
  bool bVar1;
  DiagCode noteCode;
  SourceLocation SVar2;
  Diagnostic *pDVar3;
  long in_RDI;
  Diagnostic *diag_1;
  Diagnostic *diag;
  ConstantValue val;
  ItemGroup *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL> *__range2;
  SourceRange matchRange;
  Statement *matchedStmt;
  ConstantValue cv;
  EvalContext *in_stack_fffffffffffffe28;
  EvalContext *in_stack_fffffffffffffe30;
  Expression *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  Diagnostic *in_stack_fffffffffffffe48;
  SourceLocation in_stack_fffffffffffffe50;
  Diagnostic *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  SourceLocation in_stack_fffffffffffffe80;
  SourceLocation in_stack_fffffffffffffe88;
  DiagCode in_stack_fffffffffffffe94;
  undefined1 local_d8 [40];
  undefined1 local_b0 [40];
  reference local_88;
  ItemGroup *local_80;
  __normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
  local_78;
  long local_70;
  SourceLocation local_68;
  pointer pSStack_60;
  SourceLocation local_58;
  int local_50;
  ER local_4;
  
  Expression::eval(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8691f2);
  if (bVar1) {
    local_58 = (SourceLocation)0x0;
    SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffe30);
    local_70 = in_RDI + 0x28;
    local_78._M_current =
         (ItemGroup *)
         std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>
                     *)in_stack_fffffffffffffe28);
    local_80 = (ItemGroup *)
               std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>
               ::end((span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>
                      *)in_stack_fffffffffffffe38);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe30,
                              (__normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe28), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_88 = __gnu_cxx::
                 __normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                 ::operator*(&local_78);
      not_null<const_slang::ast::Pattern_*>::operator->
                ((not_null<const_slang::ast::Pattern_*> *)0x8692d4);
      Pattern::eval((Pattern *)in_stack_fffffffffffffe48,
                    (EvalContext *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                    (ConstantValue *)in_stack_fffffffffffffe38,
                    (CaseStatementCondition)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x869315);
      in_stack_fffffffffffffe94.code._1_1_ = bVar1;
      if (bVar1) {
        bVar1 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffe30);
        in_stack_fffffffffffffe94.code._0_1_ = bVar1;
        if (bVar1) {
          if (local_88->filter == (Expression *)0x0) {
LAB_00869456:
            if (local_58 == (SourceLocation)0x0) {
              in_stack_fffffffffffffe50 =
                   (SourceLocation)
                   not_null::operator_cast_to_Statement_
                             ((not_null<const_slang::ast::Statement_*> *)0x869552);
              local_58 = in_stack_fffffffffffffe50;
              in_stack_fffffffffffffe48 =
                   (Diagnostic *)
                   not_null<const_slang::ast::Pattern_*>::operator->
                             ((not_null<const_slang::ast::Pattern_*> *)0x869573);
              local_68 = ((SourceRange *)
                         &(in_stack_fffffffffffffe48->args).
                          super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->startLoc;
              pSStack_60 = (in_stack_fffffffffffffe48->ranges).
                           super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              if ((*(int *)(in_RDI + 0x44) == 1) || (*(int *)(in_RDI + 0x44) == 2)) {
                local_50 = 0;
              }
              else {
                local_50 = 2;
              }
            }
            else {
              in_stack_fffffffffffffe70 =
                   (Diagnostic *)
                   not_null<const_slang::ast::Pattern_*>::operator->
                             ((not_null<const_slang::ast::Pattern_*> *)0x86948a);
              range_00.endLoc = in_stack_fffffffffffffe88;
              range_00.startLoc = in_stack_fffffffffffffe80;
              pDVar3 = EvalContext::addDiag
                                 ((EvalContext *)
                                  CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                  in_stack_fffffffffffffe94,range_00);
              noteCode = SUB84((ulong)pDVar3 >> 0x20,0);
              SVar2 = (SourceLocation)
                      Diagnostic::operator<<
                                ((Diagnostic *)in_stack_fffffffffffffe30,
                                 (ConstantValue *)in_stack_fffffffffffffe28);
              range.endLoc = SVar2;
              range.startLoc = in_stack_fffffffffffffe50;
              Diagnostic::addNote(in_stack_fffffffffffffe48,noteCode,range);
              local_50 = 2;
            }
          }
          else {
            Expression::eval(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
            in_stack_fffffffffffffe88 = (SourceLocation)local_b0;
            in_stack_fffffffffffffe80 = (SourceLocation)local_d8;
            slang::ConstantValue::operator=
                      ((ConstantValue *)in_stack_fffffffffffffe30,
                       (ConstantValue *)in_stack_fffffffffffffe28);
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x8693f2);
            bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8693fc);
            in_stack_fffffffffffffe94.subsystem._1_1_ = bVar1;
            if (bVar1) {
              in_stack_fffffffffffffe7f =
                   slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffe30);
              if ((bool)in_stack_fffffffffffffe7f) goto LAB_00869456;
              local_50 = 3;
            }
            else {
              local_4 = Fail;
              local_50 = 1;
            }
          }
        }
        else {
          local_50 = 3;
        }
      }
      else {
        local_4 = Fail;
        local_50 = 1;
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x8695d2);
      if (local_50 != 0) {
        if (local_50 == 2) break;
        if (local_50 != 3) goto LAB_00869786;
      }
      in_stack_fffffffffffffe44 = local_50;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
      ::operator++(&local_78);
    }
    if (local_58 == (SourceLocation)0x0) {
      local_58 = *(SourceLocation *)(in_RDI + 0x38);
    }
    if (local_58 == (SourceLocation)0x0) {
      if ((*(int *)(in_RDI + 0x44) == 3) || (*(int *)(in_RDI + 0x44) == 1)) {
        range_01.endLoc = in_stack_fffffffffffffe88;
        range_01.startLoc = in_stack_fffffffffffffe80;
        pDVar3 = EvalContext::addDiag
                           ((EvalContext *)
                            CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                            in_stack_fffffffffffffe94,range_01);
        if (*(int *)(in_RDI + 0x44) == 3) {
          sv((char *)pDVar3,(size_t)in_stack_fffffffffffffe28);
        }
        else {
          sv((char *)pDVar3,(size_t)in_stack_fffffffffffffe28);
        }
        arg._M_len._7_1_ = in_stack_fffffffffffffe7f;
        arg._M_len._0_7_ = in_stack_fffffffffffffe78;
        arg._M_str = (char *)in_stack_fffffffffffffe80;
        Diagnostic::operator<<(in_stack_fffffffffffffe70,arg);
        Diagnostic::operator<<(pDVar3,(ConstantValue *)in_stack_fffffffffffffe28);
      }
      local_4 = Success;
      local_50 = 1;
    }
    else {
      local_4 = Statement::eval((Statement *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_50 = 1;
    }
  }
  else {
    local_4 = Fail;
    local_50 = 1;
  }
LAB_00869786:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x869793);
  return local_4;
}

Assistant:

ER PatternCaseStatement::evalImpl(EvalContext& context) const {
    auto cv = expr.eval(context);
    if (!cv)
        return ER::Fail;

    const Statement* matchedStmt = nullptr;
    SourceRange matchRange;

    for (auto& item : items) {
        auto val = item.pattern->eval(context, cv, condition);
        if (!val)
            return ER::Fail;

        if (!val.isTrue())
            continue;

        if (item.filter) {
            val = item.filter->eval(context);
            if (!val)
                return ER::Fail;

            if (!val.isTrue())
                continue;
        }

        // If we already matched with a previous item, the only we reason
        // we'd still get here is to check for uniqueness. The presence of
        // another match means we failed the uniqueness check.
        if (matchedStmt) {
            auto& diag =
                context.addDiag(diag::ConstEvalCaseItemsNotUnique, item.pattern->sourceRange) << cv;
            diag.addNote(diag::NotePreviousMatch, matchRange);
            break;
        }

        matchedStmt = item.stmt;
        matchRange = item.pattern->sourceRange;

        if (check != UniquePriorityCheck::Unique && check != UniquePriorityCheck::Unique0)
            break;
    }

    if (!matchedStmt)
        matchedStmt = defaultCase;

    if (matchedStmt)
        return matchedStmt->eval(context);

    if (check == UniquePriorityCheck::Priority || check == UniquePriorityCheck::Unique) {
        auto& diag = context.addDiag(diag::ConstEvalNoCaseItemsMatched, expr.sourceRange);
        diag << (check == UniquePriorityCheck::Priority ? "priority"sv : "unique"sv);
        diag << cv;
    }

    return ER::Success;
}